

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O2

void __thiscall AnalogConsumer::initialize(AnalogConsumer *this)

{
  int iVar1;
  const_iterator __position;
  pointer piVar2;
  ulong in_RAX;
  size_t i;
  ulong uVar3;
  undefined8 uStack_38;
  
  __position._M_current =
       (this->args).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  this->il_byte_loc = *__position._M_current;
  uStack_38 = in_RAX;
  std::vector<int,_std::allocator<int>_>::erase(&(this->args).indices,__position);
  for (uVar3 = 0;
      piVar2 = (this->args).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->args).indices.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)piVar2 >> 2);
      uVar3 = uVar3 + 2) {
    iVar1 = piVar2[uVar3 + 1];
    if (iVar1 != -1) {
      if (this->il_byte_loc < 0) {
        std::operator<<((ostream *)&std::cerr,
                        "AnalogConsumer error: User requested interleaved data but id byte location not set\n"
                       );
        this->il_byte_loc = 0;
      }
      uStack_38._0_6_ = CONCAT15((char)(1 << ((byte)iVar1 & 0x1f)),(undefined5)uStack_38);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (&this->il_id_masks,(value_type_conflict2 *)((long)&uStack_38 + 5));
      uStack_38 = uStack_38 & 0xffffffffffff;
      std::vector<short,_std::allocator<short>_>::emplace_back<short>
                (&this->prev_interleaved,(short *)((long)&uStack_38 + 6));
    }
  }
  HFSubConsumer::initialize(&this->super_HFSubConsumer);
  return;
}

Assistant:

void AnalogConsumer::initialize(){
    //Get interleaved byte location
    il_byte_loc = args.indices.front();
    args.indices.erase(args.indices.begin());

    //Create masks for recognizing which interleaved data user wants
    for(size_t i = 0; i < args.indices.size(); i+=2){
//        int byte = args.indices[i];
        int bit = args.indices[i+1];
        if(bit == -1) continue; //Ignore everything if not interleaved
        if(il_byte_loc < 0){
            //if il byte location is not set, but user wants il data
            std::cerr << "AnalogConsumer error: User requested interleaved data but id byte location not set\n";
            il_byte_loc = 0; // TODO: let user handle error
        }
        uint8_t m = 0;
        m |= 1 << bit; //set the id bit
        il_id_masks.push_back(m);
        prev_interleaved.push_back(0); //set prev interleaved value
    }
    HFSubConsumer::initialize();
}